

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O0

string_view RenX::getTeamName(TeamType team)

{
  string_view sVar1;
  size_t sStack_18;
  TeamType team_local;
  undefined8 local_10;
  
  if (team == GDI) {
    sStack_18 = GDIShortName._M_len;
    local_10 = GDIShortName._M_str;
  }
  else if (team == Nod) {
    sStack_18 = NodShortName._M_len;
    local_10 = NodShortName._M_str;
  }
  else {
    sStack_18 = OtherShortName._M_len;
    local_10 = OtherShortName._M_str;
  }
  sVar1._M_str = local_10;
  sVar1._M_len = sStack_18;
  return sVar1;
}

Assistant:

std::string_view RenX::getTeamName(TeamType team)
{
	switch (team)
	{
	case RenX::TeamType::GDI:
		return GDIShortName;
	case RenX::TeamType::Nod:
		return NodShortName;
	default:
		return OtherShortName;
	}
}